

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::PageLocation::read(PageLocation *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined4 in_register_00000034;
  bool isset_first_row_index;
  bool isset_compressed_page_size;
  bool isset_offset;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff38;
  TProtocolExceptionType in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  TProtocol *in_stack_ffffffffffffff50;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  PageLocation *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_1c = uVar4 + local_1c;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    uVar4 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (TType *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_1c = uVar4 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 10) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (int64_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        local_1c = uVar4 + local_1c;
        bVar1 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff3c);
        local_1c = uVar4 + local_1c;
      }
    }
    else if (local_46 == 2) {
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        local_1c = uVar4 + local_1c;
        bVar2 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff3c);
        local_1c = uVar4 + local_1c;
      }
    }
    else if (local_46 == 3) {
      if (local_44 == 10) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (int64_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        local_1c = uVar4 + local_1c;
        bVar3 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff3c);
        local_1c = uVar4 + local_1c;
      }
    }
    else {
      uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                        ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      local_1c = uVar4 + local_1c;
    }
    uVar4 = duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x7174fa);
    local_1c = uVar4 + local_1c;
  }
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x717524);
  uVar5 = uVar4 + local_1c;
  local_1c = uVar5;
  if (!bVar1) {
    uVar6 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c);
    __cxa_throw(uVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar2) {
    uVar6 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c);
    __cxa_throw(uVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (bVar3) {
    std::__cxx11::string::~string(local_40);
    duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)0x717681);
    return (ulong)uVar5;
  }
  uVar6 = __cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            ((TProtocolException *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff3c);
  __cxa_throw(uVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t PageLocation::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_offset = false;
  bool isset_compressed_page_size = false;
  bool isset_first_row_index = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->offset);
          isset_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->compressed_page_size);
          isset_compressed_page_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->first_row_index);
          isset_first_row_index = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_offset)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_compressed_page_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_first_row_index)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}